

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O2

XXH64_hash_t
XXH3_hashLong_64b_withSeed(void *input,size_t len,XXH64_hash_t seed,xxh_u8 *secret,size_t secretLen)

{
  XXH64_hash_t XVar1;
  XXH3_f_scrambleAcc in_R9;
  xxh_u8 secret_1 [192];
  undefined1 auStack_d8 [192];
  
  XXH3_initCustomSecret_scalar(auStack_d8,seed);
  XVar1 = XXH3_hashLong_64b_internal(input,len,auStack_d8,0xc0,(XXH3_f_accumulate)secretLen,in_R9);
  return XVar1;
}

Assistant:

XXH_NO_INLINE XXH64_hash_t
XXH3_hashLong_64b_withSeed(const void* XXH_RESTRICT input, size_t len,
                           XXH64_hash_t seed, const xxh_u8* XXH_RESTRICT secret, size_t secretLen)
{
    (void)secret; (void)secretLen;
    return XXH3_hashLong_64b_withSeed_internal(input, len, seed,
                XXH3_accumulate, XXH3_scrambleAcc, XXH3_initCustomSecret);
}